

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void compute<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               (string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *homology,
               string *out_filename)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  ostream *poVar6;
  unsigned_long i;
  ulong uVar7;
  unsigned_long *puVar8;
  long lVar9;
  output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *local_3c0;
  string local_3b8;
  undefined1 local_398 [24];
  string local_380;
  flagser_parameters params;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  result;
  directed_flag_complex_in_memory_computer_t complex;
  filtered_directed_graph_t graph;
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar6 = std::operator<<(poVar6,(string *)filename);
  poVar6 = std::operator<<(poVar6,"...");
  std::endl<char,std::char_traits<char>>(poVar6);
  flagser_parameters::flagser_parameters(&params);
  std::__cxx11::string::assign((char *)&params.output_format);
  if (out_filename->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&params.output_name);
  }
  params.directed = true;
  std::__cxx11::string::string
            ((string *)&local_380,(filename->_M_dataplus)._M_p,(allocator *)&result);
  read_filtered_directed_graph(&graph,&local_380,&params);
  std::__cxx11::string::~string((string *)&local_380);
  get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ((flagser_parameters *)&local_3c0);
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  directed_flag_complex_in_memory_computer_t(&complex,&graph,&params);
  (*local_3c0->_vptr_output_t[2])(local_3c0,&complex);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::persistence_computer_t(&result,&complex,local_3c0,0xffffffffffffffff,2,3.4028235e+38);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::compute_persistence(&result,0,0xffff,true);
  __x = &result.betti_numbers;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,__x);
  lVar9 = local_3b8._M_string_length - (long)local_3b8._M_dataplus._M_p;
  puVar1 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8);
  if (lVar9 == (long)puVar1 - (long)puVar2) {
    uVar7 = 0;
    do {
      if ((ulong)((long)(homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar7)
      goto LAB_0013c79d;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8,__x);
      uVar3 = *(unsigned_long *)(local_3b8._M_dataplus._M_p + uVar7 * 8);
      uVar4 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3b8);
      uVar7 = uVar7 + 1;
    } while (uVar3 == uVar4);
  }
  std::operator<<((ostream *)&std::cout,"Expected betti numbers: ");
  puVar5 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (homology->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar5; puVar8 = puVar8 + 1) {
    std::__cxx11::to_string(&local_3b8,*puVar8);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_3b8);
    std::operator<<(poVar6," ");
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  std::operator<<((ostream *)&std::cout,"; computed: ");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_398,__x);
  for (; local_398._0_8_ != local_398._8_8_; local_398._0_8_ = local_398._0_8_ + 8) {
    std::__cxx11::to_string(&local_3b8,*(unsigned_long *)local_398._0_8_);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_3b8);
    std::operator<<(poVar6," ");
    std::__cxx11::string::~string((string *)&local_3b8);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_398);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar6 = std::operator<<((ostream *)&std::cout,"FAILED");
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_0013c79d:
  poVar6 = std::operator<<((ostream *)&std::cout,"All good.");
  std::endl<char,std::char_traits<char>>(poVar6);
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::~persistence_computer_t(&result);
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
  ~directed_flag_complex_in_memory_computer_t(&complex);
  if (local_3c0 !=
      (output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
       *)0x0) {
    (*local_3c0->_vptr_output_t[1])();
  }
  filtered_directed_graph_t::~filtered_directed_graph_t(&graph);
  flagser_parameters::~flagser_parameters(&params);
  return;
}

Assistant:

void compute(std::string&& filename, std::vector<size_t> homology, std::string out_filename = "") {
	std::cout << "Testing " << filename << "..." << std::endl;
	flagser_parameters params;
	params.output_format = out_filename.size() == 0 ? "none" : "barcode";
	if (out_filename.size() > 0) { params.output_name = out_filename; }
	params.directed = true;
	filtered_directed_graph_t graph = read_filtered_directed_graph(filename.c_str(), params);

	size_t max_entries = std::numeric_limits<size_t>::max();
	coefficient_t modulus = 2;

	unsigned short max_dimension = std::numeric_limits<unsigned short>::max();
	unsigned short min_dimension = 0;

	auto output = get_output<T>(params);
	T complex(graph, params);

	output->set_complex(&complex);

	auto result = persistence_computer_t<decltype(complex)>(complex, output.get(), max_entries, modulus);
	result.compute_persistence(min_dimension, max_dimension);

	bool correct = true;

	if (result.get_betti_numbers().size() != homology.size()) {
		correct = false;
	} else {
		for (auto i = 0ul; i < homology.size(); i++) {
			if (result.get_betti_numbers()[i] != homology[i]) {
				correct = false;
				break;
			}
		}
	}

	if (!correct) {
		std::cout << "Expected betti numbers: ";
		for (auto b : homology) std::cout << std::to_string(b) << " ";
		std::cout << "; computed: ";
		for (auto b : result.get_betti_numbers()) std::cout << std::to_string(b) << " ";
		std::cout << std::endl;
		std::cout << "FAILED" << std::endl;
		//   throw std::logic_error(std::string("Wrong betti numbers computed."));
	}

	std::cout << "All good." << std::endl;
}